

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

bool __thiscall spvtools::opt::Instruction::IsFoldableByFoldScalar(Instruction *this)

{
  IRContext *this_00;
  DefUseManager *this_01;
  pointer pOVar1;
  uint **ppuVar2;
  bool bVar3;
  char cVar4;
  uint32_t id;
  InstructionFolder *this_02;
  Instruction *type_inst;
  uint **ppuVar5;
  pointer pOVar6;
  InstructionFolder *local_48;
  Instruction *local_40;
  code *local_38;
  code *local_30;
  uint *local_28;
  
  this_02 = IRContext::get_instruction_folder(this->context_);
  bVar3 = InstructionFolder::IsFoldableOpcode(this_02,this->opcode_);
  if (bVar3) {
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    this_01 = (this_00->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    id = 0;
    if (this->has_type_id_ == true) {
      id = GetSingleWordOperand(this,0);
    }
    type_inst = analysis::DefUseManager::GetDef(this_01,id);
    bVar3 = InstructionFolder::IsFoldableScalarType(this_02,type_inst);
    if (bVar3) {
      local_30 = std::
                 _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp:772:29)>
                 ::_M_invoke;
      local_38 = std::
                 _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp:772:29)>
                 ::_M_manager;
      pOVar6 = (this->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pOVar1 = (this->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_48 = this_02;
      local_40 = this;
      if (pOVar6 == pOVar1) {
        bVar3 = true;
      }
      else {
        do {
          if ((pOVar6->type & ~SPV_OPERAND_TYPE_ID) != SPV_OPERAND_TYPE_TYPE_ID) {
            ppuVar2 = (uint **)(pOVar6->words).large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            ppuVar5 = &(pOVar6->words).small_data_;
            if (ppuVar2 != (uint **)0x0) {
              ppuVar5 = ppuVar2;
            }
            local_28 = *ppuVar5;
            if (local_38 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            cVar4 = (*local_30)(&local_48,&local_28);
            if (cVar4 == '\0') {
              bVar3 = false;
              goto LAB_00225ac7;
            }
          }
          pOVar6 = pOVar6 + 1;
        } while (pOVar6 != pOVar1);
        bVar3 = true;
LAB_00225ac7:
        if (local_38 == (code *)0x0) {
          return bVar3;
        }
      }
      (*local_38)(&local_48,&local_48,3);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool Instruction::IsFoldableByFoldScalar() const {
  const InstructionFolder& folder = context()->get_instruction_folder();
  if (!folder.IsFoldableOpcode(opcode())) {
    return false;
  }

  Instruction* type = context()->get_def_use_mgr()->GetDef(type_id());
  if (!folder.IsFoldableScalarType(type)) {
    return false;
  }

  // Even if the type of the instruction is foldable, its operands may not be
  // foldable (e.g., comparisons of 64bit types).  Check that all operand types
  // are foldable before accepting the instruction.
  return WhileEachInOperand([&folder, this](const uint32_t* op_id) {
    Instruction* def_inst = context()->get_def_use_mgr()->GetDef(*op_id);
    Instruction* def_inst_type =
        context()->get_def_use_mgr()->GetDef(def_inst->type_id());
    return folder.IsFoldableScalarType(def_inst_type);
  });
}